

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::removeNamedItem(QDomNamedNodeMapPrivate *this,QString *name)

{
  QDomNamedNodeMapPrivate *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  QDomNodePrivate *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffc0;
  QDomNodePrivate *local_28;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    local_28 = namedItem(in_RSI,in_stack_ffffffffffffffc0);
    if (local_28 == (QDomNodePrivate *)0x0) {
      local_28 = (QDomNodePrivate *)0x0;
    }
    else if ((*(byte *)(in_RDI + 0x21) & 1) == 0) {
      QDomNodePrivate::nodeName(in_stack_ffffffffffffffa8);
      QMultiHash<QString,_QDomNodePrivate_*>::remove
                ((QMultiHash<QString,_QDomNodePrivate_*> *)(in_RDI + 8),local_20);
      QString::~QString((QString *)0x1129e1);
      QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1129ef);
    }
    else {
      local_28 = (QDomNodePrivate *)
                 (**(code **)(**(long **)(in_RDI + 0x18) + 0x30))
                           (*(long **)(in_RDI + 0x18),local_28);
    }
  }
  else {
    local_28 = (QDomNodePrivate *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::removeNamedItem(const QString& name)
{
    if (readonly)
        return nullptr;

    QDomNodePrivate* p = namedItem(name);
    if (p == nullptr)
        return nullptr;
    if (appendToParent)
        return parent->removeChild(p);

    map.remove(p->nodeName());
    // We took a reference, so we have to free one here
    p->ref.deref();
    return p;
}